

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O2

Element * Rml::ElementUtilities::GetElementById(Element *root_element,String *id)

{
  __type _Var1;
  int iVar2;
  String *__lhs;
  int i;
  int index;
  Element *this;
  SearchQueue search_queue;
  Element *local_88;
  Element *local_80;
  _Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_> local_78;
  
  local_80 = root_element;
  ::std::queue<Rml::Element*,std::deque<Rml::Element*,std::allocator<Rml::Element*>>>::
  queue<std::deque<Rml::Element*,std::allocator<Rml::Element*>>,void>
            ((queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_> *)
             &local_78);
  ::std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>::push_back
            ((deque<Rml::Element_*,_std::allocator<Rml::Element_*>_> *)&local_78,&local_80);
  while (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_78._M_impl.super__Deque_impl_data._M_start._M_cur) {
    this = *local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
    ::std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>::pop_front
              ((deque<Rml::Element_*,_std::allocator<Rml::Element_*>_> *)&local_78);
    __lhs = Element::GetId_abi_cxx11_(this);
    _Var1 = ::std::operator==(__lhs,id);
    if (_Var1) goto LAB_00298a4d;
    index = 0;
    while( true ) {
      iVar2 = Element::GetNumChildren(this,false);
      if (iVar2 <= index) break;
      local_88 = Element::GetChild(this,index);
      ::std::deque<Rml::Element*,std::allocator<Rml::Element*>>::emplace_back<Rml::Element*>
                ((deque<Rml::Element*,std::allocator<Rml::Element*>> *)&local_78,&local_88);
      index = index + 1;
    }
  }
  this = (Element *)0x0;
LAB_00298a4d:
  ::std::_Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>::~_Deque_base(&local_78);
  return this;
}

Assistant:

Element* ElementUtilities::GetElementById(Element* root_element, const String& id)
{
	// Breadth first search on elements for the corresponding id
	typedef Queue<Element*> SearchQueue;
	SearchQueue search_queue;
	search_queue.push(root_element);

	while (!search_queue.empty())
	{
		Element* element = search_queue.front();
		search_queue.pop();

		if (element->GetId() == id)
		{
			return element;
		}

		// Add all children to search
		for (int i = 0; i < element->GetNumChildren(); i++)
			search_queue.push(element->GetChild(i));
	}

	return nullptr;
}